

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O2

void __thiscall
SyncFixture_SyncBetweenVersions_Test::~SyncFixture_SyncBetweenVersions_Test
          (SyncFixture_SyncBetweenVersions_Test *this)

{
  anon_unknown.dwarf_2f1133::SyncFixture::~SyncFixture(&this->super_SyncFixture);
  operator_delete(this,0x158);
  return;
}

Assistant:

TEST_F (SyncFixture, SyncBetweenVersions) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "key0", "doesn't change");
        this->add (t1, "key1", "first value");
        t1.commit ();
    }
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "key1", "second value");
        t2.commit ();
    }

    std::string value;

    this->read ("key1", &value);
    EXPECT_THAT (value, ::testing::StrEq ("second value"));
    this->read ("key0", &value);
    EXPECT_THAT (value, ::testing::StrEq ("doesn't change"));

    db_.sync (0);
    EXPECT_TRUE (db_.get_current_revision () == 0) << "The current revision should be 0";
    EXPECT_FALSE (this->is_found ("key0")) << "key0 should not be present at revision 0";
    EXPECT_FALSE (this->is_found ("key1")) << "key1 should not be present at revision 0";

    db_.sync (1);
    EXPECT_TRUE (db_.get_current_revision () == 1) << "The current revision should be 1";
    this->read ("key1", &value);
    EXPECT_THAT (value, ::testing::StrEq ("first value"));
    this->read ("key0", &value);
    EXPECT_THAT (value, ::testing::StrEq ("doesn't change"));

    db_.sync (2);
    EXPECT_TRUE (db_.get_current_revision () == 2) << "The current revision should be 2";
    this->read ("key1", &value);
    EXPECT_THAT (value, ::testing::StrEq ("second value"));
    this->read ("key0", &value);
    EXPECT_THAT (value, ::testing::StrEq ("doesn't change"));

    db_.sync (1);
    EXPECT_TRUE (db_.get_current_revision () == 1) << "The current revision should be 1";
    this->read ("key1", &value);
    EXPECT_THAT (value, ::testing::StrEq ("first value"));
    this->read ("key0", &value);
    EXPECT_THAT (value, ::testing::StrEq ("doesn't change"));
}